

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

tb_page_addr_t
get_page_addr_code_hostp_ppc64(CPUArchState_conflict23 *env,target_ulong addr,void **hostp)

{
  int mmu_idx;
  _Bool _Var1;
  uintptr_t size_mask;
  tb_page_addr_t tVar2;
  long lVar3;
  long lVar4;
  ulong index;
  long lVar5;
  ulong page;
  long lVar6;
  void *ptr;
  CPUPPCState_conflict2 *__mptr;
  
  mmu_idx = env->immu_idx;
  lVar6 = (long)mmu_idx * 0x10;
  lVar3 = *(long *)((long)env + lVar6 + -0xa8);
  index = *(ulong *)((long)env + lVar6 + -0xb0) >> 6 & addr >> 0xc;
  lVar4 = index * 0x40;
  lVar5 = lVar3 + lVar4;
  page = addr & 0xfffffffffffff000;
  if ((*(ulong *)(lVar3 + 0x10 + lVar4) & 0xfffffffffffff800) != page) {
    _Var1 = victim_tlb_hit(env,(long)mmu_idx,index,0x10,page);
    if (!_Var1) {
      tlb_fill((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,addr,0,MMU_INST_FETCH,mmu_idx,0);
      lVar5 = *(long *)((long)env + lVar6 + -0xa8);
      lVar3 = (*(ulong *)((long)env + lVar6 + -0xb0) >> 6 & addr >> 0xc) * 0x40;
      if ((*(byte *)(lVar5 + 0x11 + lVar3) & 8) != 0) {
        return 0xffffffffffffffff;
      }
      lVar5 = lVar5 + lVar3;
    }
    if ((*(ulong *)(lVar5 + 0x10) & 0xfffffffffffff800) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_ppc64(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((*(byte *)(lVar5 + 0x11) & 2) == 0) {
    ptr = (void *)(addr + *(long *)(lVar5 + 0x20));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    tVar2 = qemu_ram_addr_from_host_ppc64(env->uc,ptr);
    if (tVar2 == 0xffffffffffffffff) {
      abort();
    }
  }
  else {
    tVar2 = 0xffffffffffffffff;
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  return tVar2;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}